

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::DrawWallAddClamp1PalCommand::Execute
          (DrawWallAddClamp1PalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int pass_skip;
  uint uVar12;
  byte *pbVar13;
  uint uVar14;
  ulong uVar15;
  
  iVar1 = (this->super_PalWall1Command)._count;
  iVar10 = (this->super_PalWall1Command).super_DrawerCommand._dest_y;
  iVar9 = thread->pass_end_y - iVar10;
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  if (iVar1 < iVar9) {
    iVar9 = iVar1;
  }
  uVar12 = thread->pass_start_y - iVar10;
  if ((int)uVar12 < 1) {
    uVar12 = 0;
  }
  iVar1 = thread->num_cores;
  iVar10 = (iVar1 - (int)((iVar10 + uVar12) - thread->core) % iVar1) % iVar1;
  uVar15 = (long)(int)((~uVar12 + iVar1 + iVar9) - iVar10) / (long)iVar1;
  uVar8 = uVar15 & 0xffffffff;
  if (0 < (int)uVar15) {
    puVar4 = (this->super_PalWall1Command)._colormap;
    puVar5 = (this->super_PalWall1Command)._source;
    iVar9 = (this->super_PalWall1Command)._fracbits;
    puVar6 = (this->super_PalWall1Command)._srcblend;
    puVar7 = (this->super_PalWall1Command)._destblend;
    iVar2 = (this->super_PalWall1Command)._pitch;
    iVar10 = iVar10 + uVar12;
    pbVar13 = (this->super_PalWall1Command)._dest + iVar2 * iVar10;
    iVar3 = *(int *)&(this->super_PalWall1Command).super_DrawerCommand.field_0xc;
    uVar12 = iVar10 * iVar3 + (this->super_PalWall1Command)._texturefrac;
    do {
      uVar15 = (ulong)puVar5[uVar12 >> ((byte)iVar9 & 0x3f)];
      if (uVar15 != 0) {
        uVar11 = puVar7[*pbVar13] + puVar6[puVar4[uVar15]];
        uVar14 = uVar11 & 0x40100400;
        uVar11 = uVar14 - (uVar14 >> 5) | uVar11 & 0x3e0f83e0 | 0x1f07c1f;
        *pbVar13 = RGB32k.All[uVar11 >> 0xf & uVar11];
      }
      uVar12 = uVar12 + iVar3 * iVar1;
      pbVar13 = pbVar13 + iVar2 * iVar1;
      uVar11 = (int)uVar8 - 1;
      uVar8 = (ulong)uVar11;
    } while (uVar11 != 0);
  }
  return;
}

Assistant:

void DrawWallAddClamp1PalCommand::Execute(DrawerThread *thread)
	{
		uint32_t fracstep = _iscale;
		uint32_t frac = _texturefrac;
		uint8_t *colormap = _colormap;
		int count = _count;
		const uint8_t *source = _source;
		uint8_t *dest = _dest;
		int bits = _fracbits;
		int pitch = _pitch;

		uint32_t *fg2rgb = _srcblend;
		uint32_t *bg2rgb = _destblend;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * thread->skipped_by_thread(_dest_y);
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		do
		{
			uint8_t pix = source[frac >> bits];
			if (pix != 0)
			{
				uint32_t a = fg2rgb[colormap[pix]] + bg2rgb[*dest];
				uint32_t b = a;

				a |= 0x01f07c1f;
				b &= 0x40100400;
				a &= 0x3fffffff;
				b = b - (b >> 5);
				a |= b;
				*dest = RGB32k.All[a & (a >> 15)];
			}
			frac += fracstep;
			dest += pitch;
		} while (--count);
	}